

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O2

void event_signal_birthpoints(int *points,int *inc_points,wchar_t remaining)

{
  game_event_data data;
  
  data.string = (char *)points;
  data.explosion.distance_to_grid = inc_points;
  data.birthstage.n_choices = remaining;
  game_event_dispatch(EVENT_BIRTHPOINTS,&data);
  return;
}

Assistant:

void event_signal_birthpoints(const int *points, const int *inc_points,
		int remaining)
{
	game_event_data data;

	data.birthpoints.points = points;
	data.birthpoints.inc_points = inc_points;
	data.birthpoints.remaining = remaining;

	game_event_dispatch(EVENT_BIRTHPOINTS, &data);
}